

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase694::run(TestCase694 *this)

{
  StructDataBitCount *this_00;
  initializer_list<unsigned_int> init;
  bool bVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  Builder local_2b0;
  bool local_291;
  undefined1 local_290 [7];
  bool _kj_shouldLog_2;
  char (*local_278) [4];
  undefined1 local_270 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_2;
  undefined1 local_230 [5];
  bool _kj_shouldLog_1;
  DebugExpression<bool> _kjCondition_1;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_210;
  size_t local_200;
  uint local_1f8;
  bool local_1f1;
  undefined1 auStack_1f0 [7];
  bool _kj_shouldLog;
  size_t local_1e8;
  size_t local_1e0;
  uint local_1d8;
  DebugExpression<unsigned_int> local_1d4;
  undefined1 local_1d0 [8];
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_198;
  word *local_188;
  word *zerosEnd;
  undefined4 local_178;
  undefined4 local_174;
  iterator local_170;
  undefined8 local_168;
  ArrayPtr<const_unsigned_int> local_160;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_150;
  word *local_140;
  word *zerosStart;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase694 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  local_150 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[](&local_150,0);
  local_140 = kj::ArrayPtr<const_capnp::word>::end(pAVar2);
  zerosEnd._4_4_ = 0xc;
  local_178 = 0x22;
  local_174 = 0x38;
  local_170 = (iterator)((long)&zerosEnd + 4);
  local_168 = 3;
  init._M_len = 3;
  init._M_array = local_170;
  kj::ArrayPtr<const_unsigned_int>::ArrayPtr(&local_160,init);
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt32List((Builder *)local_128,local_160);
  local_198 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[](&local_198,0);
  local_188 = kj::ArrayPtr<const_capnp::word>::end(pAVar2);
  Text::Reader::Reader((Reader *)&_kjCondition.result,"foo");
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField
            ((Builder *)local_128,(Reader)stack0xfffffffffffffe58);
  local_1d8 = 1;
  local_1d4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1d8);
  _auStack_1f0 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  local_1e0 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_1f0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_long> *)local_1d0,&local_1d4,&local_1e0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1d0);
  if (!bVar1) {
    local_1f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f1 != false) {
      local_1f8 = 1;
      AVar3 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
      local_210 = AVar3;
      local_200 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size(&local_210);
      kj::_::Debug::
      log<char_const(&)[65],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x2c0,ERROR,
                 "\"failed: expected \" \"(1u) == (builder.getSegmentsForOutput().size())\", _kjCondition, 1u, builder.getSegmentsForOutput().size()"
                 ,(char (*) [65])"failed: expected (1u) == (builder.getSegmentsForOutput().size())",
                 (DebugComparison<unsigned_int,_unsigned_long> *)local_1d0,&local_1f8,&local_200);
      local_1f1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::disownUInt32List
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_230,(Builder *)local_128);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::~Orphan
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_230);
  _kjCondition_2._54_1_ = allZero(local_140,local_188);
  _kjCondition_2._55_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_2.field_0x36);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_2.field_0x37);
  if (!bVar1) {
    _kjCondition_2._53_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._53_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[47],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x2c4,ERROR,
                 "\"failed: expected \" \"allZero(zerosStart, zerosEnd)\", _kjCondition",
                 (char (*) [47])"failed: expected allZero(zerosStart, zerosEnd)",
                 (DebugExpression<bool> *)&_kjCondition_2.field_0x37);
      _kjCondition_2._53_1_ = 0;
    }
  }
  local_278 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
            ((Builder *)local_290,(Builder *)local_128);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_270,
             (DebugExpression<char_const(&)[4]> *)&local_278,(Builder *)local_290);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_270);
  if (!bVar1) {
    local_291 = kj::_::Debug::shouldLog(ERROR);
    while (local_291 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                (&local_2b0,(Builder *)local_128);
      kj::_::Debug::
      log<char_const(&)[50],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x2c6,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (root.getTextField())\", _kjCondition, \"foo\", root.getTextField()"
                 ,(char (*) [50])"failed: expected (\"foo\") == (root.getTextField())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_270,
                 (char (*) [4])"foo",&local_2b0);
      local_291 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Orphans, ListsZerodAfterUse) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  const word* zerosStart = builder.getSegmentsForOutput()[0].end();
  root.setUInt32List({12, 34, 56});
  const word* zerosEnd = builder.getSegmentsForOutput()[0].end();

  root.setTextField("foo");  // guard against overruns

  EXPECT_EQ(1u, builder.getSegmentsForOutput().size());  // otherwise test is invalid

  root.disownUInt32List();

  EXPECT_TRUE(allZero(zerosStart, zerosEnd));

  EXPECT_EQ("foo", root.getTextField());
}